

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<unsigned_int> __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::smallestHoleAtLeast
          (DataLocationUsage *this,DataLocation *location,uint lgSize)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint in_ECX;
  undefined4 in_register_00000014;
  uint *puVar4;
  ulong uVar5;
  bool bVar6;
  
  puVar4 = (uint *)CONCAT44(in_register_00000014,lgSize);
  if ((char)location->lgSize == '\0') {
    uVar2 = *puVar4;
    if (in_ECX <= uVar2) {
      this->isUsed = true;
      *(uint *)((this->holes).holes + 2) = uVar2;
      return (Maybe<unsigned_int>)this;
    }
LAB_0017aee4:
    this->isUsed = false;
    return (Maybe<unsigned_int>)this;
  }
  bVar1 = *(byte *)((long)&location->lgSize + 1);
  if (in_ECX < bVar1) {
    if (in_ECX < 6) {
      bVar6 = true;
      uVar3 = (ulong)in_ECX;
      if (*(char *)((long)&location->lgSize + (ulong)in_ECX + 2) == '\0') {
        do {
          uVar5 = uVar3;
          if ((int)(uVar5 + 1) == 6) goto LAB_0017ae81;
          in_ECX = in_ECX + 1;
          uVar3 = uVar5 + 1;
        } while (*(char *)((long)&location->lgSize + uVar5 + 3) == '\0');
        bVar6 = uVar5 < 5;
      }
    }
    else {
LAB_0017ae81:
      bVar6 = false;
    }
    if (!bVar6) {
      if ((uint)bVar1 <= *puVar4 && *puVar4 != (uint)bVar1) {
        this->isUsed = true;
        *(uint *)((this->holes).holes + 2) = (uint)bVar1;
        return (Maybe<unsigned_int>)this;
      }
      goto LAB_0017aee4;
    }
  }
  else if (*puVar4 <= in_ECX) goto LAB_0017aee4;
  this->isUsed = true;
  *(uint *)((this->holes).holes + 2) = in_ECX;
  return (Maybe<unsigned_int>)this;
}

Assistant:

kj::Maybe<uint> smallestHoleAtLeast(Union::DataLocation& location, uint lgSize) {
        // Find the smallest single hole that is at least the given size.  This is used to find the
        // optimal place to allocate each field -- it is placed in the smallest slot where it fits,
        // to reduce fragmentation.  Returns the size of the hole, if found.

        if (!isUsed) {
          // The location is effectively one big hole.
          if (lgSize <= location.lgSize) {
            return location.lgSize;
          } else {
            return nullptr;
          }
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any current
          // holes, but if the location's size is larger than what we're using, we'd be able to
          // expand.
          if (lgSize < location.lgSize) {
            return lgSize;
          } else {
            return nullptr;
          }
        } else KJ_IF_MAYBE(result, holes.smallestAtLeast(lgSize)) {
          // There's a hole.
          return *result;
        } else {
          // The requested size is smaller than what we're already using, but there are no holes
          // available.  If we could double our size, then we could allocate in the new space.

          if (lgSizeUsed < location.lgSize) {
            // We effectively create a new hole the same size as the current usage.
            return lgSizeUsed;
          } else {
            return nullptr;
          }
        }
      }